

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O1

void __thiscall VW::vw_exception::~vw_exception(vw_exception *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__vw_exception_002eae00;
  pcVar1 = (this->message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->message).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

const char* vw_exception::what() const _NOEXCEPT { return message.c_str(); }